

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O3

void FAudio_OPERATIONSET_ClearAllForVoice(FAudioVoice *voice)

{
  FAudio_OPERATIONSET_Type FVar1;
  FAudio_OPERATIONSET_Operation **ppFVar2;
  long lVar3;
  FAudioFreeFunc p_Var4;
  FAudio_OPERATIONSET_Operation *pFVar5;
  FAudio_OPERATIONSET_Operation *pFVar6;
  FAudio_OPERATIONSET_Operation *pFVar7;
  FAudio *pFVar8;
  bool bVar9;
  
  FAudio_PlatformLockMutex(voice->audio->operationLock);
  pFVar8 = voice->audio;
  if (pFVar8->queuedOperations != (FAudio_OPERATIONSET_Operation *)0x0) {
    pFVar5 = (FAudio_OPERATIONSET_Operation *)0x0;
    pFVar6 = pFVar8->queuedOperations;
    do {
      FVar1 = pFVar6->Type;
      if (FVar1 == FAUDIOOP_SETOUTPUTMATRIX) {
        bVar9 = (pFVar6->Data).SetOutputFilterParameters.pDestinationVoice == voice;
LAB_0011c95d:
        pFVar7 = pFVar6->next;
        if ((pFVar6->Voice == voice) || (bVar9)) {
          ppFVar2 = &pFVar5->next;
          if (pFVar5 == (FAudio_OPERATIONSET_Operation *)0x0) {
            ppFVar2 = &pFVar8->queuedOperations;
          }
          *ppFVar2 = pFVar7;
          p_Var4 = voice->audio->pFree;
          lVar3 = 0x18;
          if ((FVar1 != FAUDIOOP_SETEFFECTPARAMETERS) && (FVar1 != FAUDIOOP_SETCHANNELVOLUMES)) {
            if (FVar1 != FAUDIOOP_SETOUTPUTMATRIX) goto LAB_0011c9c6;
            lVar3 = 0x20;
          }
          (*p_Var4)(*(void **)((long)&pFVar6->Type + lVar3));
          goto LAB_0011c9c6;
        }
      }
      else {
        if ((FVar1 != FAUDIOOP_SETOUTPUTFILTERPARAMETERS) ||
           ((pFVar6->Data).SetOutputFilterParameters.pDestinationVoice != voice)) {
          bVar9 = false;
          goto LAB_0011c95d;
        }
        ppFVar2 = &pFVar5->next;
        if (pFVar5 == (FAudio_OPERATIONSET_Operation *)0x0) {
          ppFVar2 = &pFVar8->queuedOperations;
        }
        pFVar7 = pFVar6->next;
        *ppFVar2 = pFVar7;
        p_Var4 = voice->audio->pFree;
LAB_0011c9c6:
        (*p_Var4)(pFVar6);
        pFVar6 = pFVar5;
      }
      pFVar5 = pFVar6;
      pFVar6 = pFVar7;
    } while (pFVar7 != (FAudio_OPERATIONSET_Operation *)0x0);
    pFVar8 = voice->audio;
  }
  if (pFVar8->committedOperations != (FAudio_OPERATIONSET_Operation *)0x0) {
    pFVar5 = (FAudio_OPERATIONSET_Operation *)0x0;
    pFVar6 = pFVar8->committedOperations;
    do {
      FVar1 = pFVar6->Type;
      if (FVar1 == FAUDIOOP_SETOUTPUTMATRIX) {
        bVar9 = (pFVar6->Data).SetOutputFilterParameters.pDestinationVoice == voice;
LAB_0011ca13:
        pFVar7 = pFVar6->next;
        if ((pFVar6->Voice == voice) || (bVar9)) {
          ppFVar2 = &pFVar5->next;
          if (pFVar5 == (FAudio_OPERATIONSET_Operation *)0x0) {
            ppFVar2 = &pFVar8->committedOperations;
          }
          *ppFVar2 = pFVar7;
          p_Var4 = voice->audio->pFree;
          lVar3 = 0x18;
          if ((FVar1 != FAUDIOOP_SETEFFECTPARAMETERS) && (FVar1 != FAUDIOOP_SETCHANNELVOLUMES)) {
            if (FVar1 != FAUDIOOP_SETOUTPUTMATRIX) goto LAB_0011ca7c;
            lVar3 = 0x20;
          }
          (*p_Var4)(*(void **)((long)&pFVar6->Type + lVar3));
          goto LAB_0011ca7c;
        }
      }
      else {
        if ((FVar1 != FAUDIOOP_SETOUTPUTFILTERPARAMETERS) ||
           ((pFVar6->Data).SetOutputFilterParameters.pDestinationVoice != voice)) {
          bVar9 = false;
          goto LAB_0011ca13;
        }
        ppFVar2 = &pFVar5->next;
        if (pFVar5 == (FAudio_OPERATIONSET_Operation *)0x0) {
          ppFVar2 = &pFVar8->committedOperations;
        }
        pFVar7 = pFVar6->next;
        *ppFVar2 = pFVar7;
        p_Var4 = voice->audio->pFree;
LAB_0011ca7c:
        (*p_Var4)(pFVar6);
        pFVar6 = pFVar5;
      }
      pFVar5 = pFVar6;
      pFVar6 = pFVar7;
    } while (pFVar7 != (FAudio_OPERATIONSET_Operation *)0x0);
    pFVar8 = voice->audio;
  }
  FAudio_PlatformUnlockMutex(pFVar8->operationLock);
  return;
}

Assistant:

void FAudio_OPERATIONSET_ClearAllForVoice(FAudioVoice *voice)
{
	FAudio_PlatformLockMutex(voice->audio->operationLock);
	LOG_MUTEX_LOCK(voice->audio, voice->audio->operationLock)

	RemoveFromList(voice, &voice->audio->queuedOperations);
	RemoveFromList(voice, &voice->audio->committedOperations);

	FAudio_PlatformUnlockMutex(voice->audio->operationLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->audio->operationLock)
}